

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O3

void Hop_ObjDisconnect(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  uint uVar1;
  ulong uVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopObj.c"
                  ,0xa1,"void Hop_ObjDisconnect(Hop_Man_t *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 6) != 4) {
    __assert_fail("Hop_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopObj.c"
                  ,0xa2,"void Hop_ObjDisconnect(Hop_Man_t *, Hop_Obj_t *)");
  }
  if (pObj->pFanin0 != (Hop_Obj_t *)0x0) {
    uVar2 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    uVar1 = *(uint *)(uVar2 + 0x20);
    if (uVar1 < 0x40) goto LAB_007ff835;
    *(uint *)(uVar2 + 0x20) = uVar1 - 0x40;
  }
  if (pObj->pFanin1 != (Hop_Obj_t *)0x0) {
    uVar2 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
    uVar1 = *(uint *)(uVar2 + 0x20);
    if (uVar1 < 0x40) {
LAB_007ff835:
      __assert_fail("pObj->nRefs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hop.h"
                    ,0xb2,"void Hop_ObjDeref(Hop_Obj_t *)");
    }
    *(uint *)(uVar2 + 0x20) = uVar1 - 0x40;
  }
  Hop_TableDelete(p,pObj);
  pObj->pFanin0 = (Hop_Obj_t *)0x0;
  pObj->pFanin1 = (Hop_Obj_t *)0x0;
  return;
}

Assistant:

void Hop_ObjDisconnect( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    assert( Hop_ObjIsNode(pObj) );
    // remove connections
    if ( pObj->pFanin0 != NULL )
        Hop_ObjDeref(Hop_ObjFanin0(pObj));
    if ( pObj->pFanin1 != NULL )
        Hop_ObjDeref(Hop_ObjFanin1(pObj));
    // remove the node from the structural hash table
    Hop_TableDelete( p, pObj );
    // add the first fanin
    pObj->pFanin0 = NULL;
    pObj->pFanin1 = NULL;
}